

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  uint uVar1;
  cmMakefile *pcVar2;
  cmLocalGenerator *this_00;
  pointer pbVar3;
  cmValue cVar4;
  string *psVar5;
  const_reference pvVar6;
  ostream *poVar7;
  undefined8 in_R8;
  pointer in_path;
  string_view str;
  string_view source;
  string fc;
  cmList cleanFiles;
  string cleanfile;
  string local_280;
  cmLocalUnixMakefileGenerator3 *local_260;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_258;
  string local_250;
  ofstream fout;
  
  cleanFiles.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cleanFiles.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cleanFiles.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"ADDITIONAL_CLEAN_FILES",(allocator<char> *)&cleanfile);
  cVar4 = cmMakefile::GetProperty(pcVar2,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  if (cVar4.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_250,(string *)cVar4.Value);
    pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cleanfile,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_280);
    psVar5 = cmMakefile::GetSafeDefinition(pcVar2,&cleanfile);
    fc._M_dataplus._M_p = (pointer)&fc.field_2;
    fc._M_string_length = 0;
    fc.field_2._M_local_buf[0] = '\0';
    in_R8 = 0;
    cmGeneratorExpression::Evaluate
              ((string *)&fout,&local_250,(cmLocalGenerator *)this,psVar5,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&fc);
    cmList::assign(&cleanFiles,(string *)&fout,Yes,No);
    std::__cxx11::string::~string((string *)&fout);
    std::__cxx11::string::~string((string *)&fc);
    std::__cxx11::string::~string((string *)&cleanfile);
    std::__cxx11::string::~string((string *)&local_250);
  }
  if (cleanFiles.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      cleanFiles.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar6 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::at(&((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                   LocalGenerators,0);
    psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[40]>
              (&cleanfile,psVar5,(char (*) [40])"/CMakeFiles/cmake_directory_clean.cmake");
    std::ofstream::ofstream(&fout,cleanfile._M_dataplus._M_p,_S_out);
    uVar1 = *(uint *)(&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20 +
                     (long)fout.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream[-3]);
    if ((uVar1 & 5) == 0) {
      std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                      "file(REMOVE_RECURSE\n");
      pbVar3 = cleanFiles.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_260 = this;
      local_258 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands;
      for (in_path = cleanFiles.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; in_path != pbVar3;
          in_path = in_path + 1) {
        this_00 = (pvVar6->_M_t).
                  super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                  .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
        cmsys::SystemTools::CollapseFullPath(&local_280,in_path,psVar5);
        cmOutputConverter::MaybeRelativeToCurBinDir
                  (&fc,&this_00->super_cmOutputConverter,&local_280);
        std::__cxx11::string::~string((string *)&local_280);
        poVar7 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,"  ");
        str._M_str = (char *)0x0;
        str._M_len = (size_t)fc._M_dataplus._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_280,(cmOutputConverter *)fc._M_string_length,str,(WrapQuotes)in_R8);
        poVar7 = std::operator<<(poVar7,(string *)&local_280);
        std::operator<<(poVar7,"\n");
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&fc);
      }
      std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,")\n");
      commands = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_258;
      this = local_260;
    }
    else {
      std::operator+(&fc,"Could not create ",&cleanfile);
      cmSystemTools::Error(&fc);
      std::__cxx11::string::~string((string *)&fc);
    }
    std::ofstream::~ofstream(&fout);
    if ((uVar1 & 5) == 0) {
      cmOutputConverter::MaybeRelativeToCurBinDir
                (&local_280,
                 &((pvVar6->_M_t).
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                   .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->
                  super_cmOutputConverter,&cleanfile);
      source._M_str = local_280._M_dataplus._M_p;
      source._M_len = local_280._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&fc,(cmOutputConverter *)this,source,SHELL,false);
      cmStrCat<char_const(&)[21],std::__cxx11::string>
                ((string *)&fout,(char (*) [21])"$(CMAKE_COMMAND) -P ",&fc);
      std::__cxx11::string::~string((string *)&fc);
      std::__cxx11::string::~string((string *)&local_280);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout);
      std::__cxx11::string::~string((string *)&fout);
    }
    std::__cxx11::string::~string((string *)&cleanfile);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cleanFiles.Values);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand(
  std::vector<std::string>& commands)
{
  cmList cleanFiles;
  // Look for additional files registered for cleaning in this directory.
  if (cmValue prop_value =
        this->Makefile->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    cleanFiles.assign(cmGeneratorExpression::Evaluate(
      *prop_value, this,
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE")));
  }
  if (cleanFiles.empty()) {
    return;
  }

  const auto& rootLG = this->GetGlobalGenerator()->GetLocalGenerators().at(0);
  std::string const& currentBinaryDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile =
    cmStrCat(currentBinaryDir, "/CMakeFiles/cmake_directory_clean.cmake");
  // Write clean script
  {
    cmsys::ofstream fout(cleanfile.c_str());
    if (!fout) {
      cmSystemTools::Error("Could not create " + cleanfile);
      return;
    }
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& cfl : cleanFiles) {
      std::string fc = rootLG->MaybeRelativeToCurBinDir(
        cmSystemTools::CollapseFullPath(cfl, currentBinaryDir));
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  // Create command
  {
    std::string remove = cmStrCat(
      "$(CMAKE_COMMAND) -P ",
      this->ConvertToOutputFormat(rootLG->MaybeRelativeToCurBinDir(cleanfile),
                                  cmOutputConverter::SHELL));
    commands.push_back(std::move(remove));
  }
}